

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjpeghandler.cpp
# Opt level: O0

bool ensureValidImage(QImage *dest,jpeg_decompress_struct *info,QSize *size)

{
  int iVar1;
  long lVar2;
  byte bVar3;
  undefined8 *in_RDX;
  long in_RSI;
  QImage *in_RDI;
  long in_FS_OFFSET;
  Format format;
  Format local_34;
  bool local_11;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *(int *)(in_RSI + 0x94);
  if (iVar1 == 1) {
    local_34 = Format_Grayscale8;
  }
  else if (iVar1 == 3) {
    local_34 = Format_RGB32;
  }
  else {
    if (iVar1 != 4) {
      local_11 = false;
      goto LAB_00109b15;
    }
    if (*(int *)(in_RSI + 0x40) == 4) {
      local_34 = Format_CMYK8888;
    }
    else {
      local_34 = Format_RGB32;
    }
  }
  bVar3 = QImageIOHandler::allocateImage((QSize *)*in_RDX,local_34,in_RDI);
  local_11 = (bool)(bVar3 & 1);
LAB_00109b15:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return local_11;
}

Assistant:

static bool ensureValidImage(QImage *dest, struct jpeg_decompress_struct *info,
                             const QSize& size)
{
    QImage::Format format;
    switch (info->output_components) {
    case 1:
        format = QImage::Format_Grayscale8;
        break;
    case 3:
        format = QImage::Format_RGB32;
        break;
    case 4:
        if (info->out_color_space == JCS_CMYK)
            format = QImage::Format_CMYK8888;
        else
            format = QImage::Format_RGB32;
        break;
    default:
        return false; // unsupported format
    }

    return QImageIOHandler::allocateImage(size, format, dest);
}